

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::InlinedVector(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *this,InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *other,polymorphic_allocator<pbrt::ParsedParameter_*> *alloc)

{
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIVar1;
  iterator ppPVar2;
  const_reference args;
  size_t sVar3;
  undefined8 *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  size_t i;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_20;
  
  (in_RDI->alloc).memoryResource = (memory_resource *)*in_RDX;
  in_RDI->ptr = (ParsedParameter **)0x0;
  in_RDI->nAlloc = 0;
  in_RDI->nStored = 0;
  size(in_RSI);
  reserve(in_RSI,(size_t)in_RDX);
  local_20 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)0x0;
  while( true ) {
    this_00 = local_20;
    pIVar1 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
              *)size(in_RSI);
    if (pIVar1 <= this_00) break;
    ppPVar2 = begin(in_RDI);
    ppPVar2 = ppPVar2 + (long)local_20;
    args = operator[](this_00,(size_type)ppPVar2);
    pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
    construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*const&>
              ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,ppPVar2,args);
    local_20 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)((long)&(local_20->alloc).memoryResource + 1);
  }
  sVar3 = size(in_RSI);
  in_RDI->nStored = sVar3;
  return;
}

Assistant:

InlinedVector(const InlinedVector &other, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(begin() + i, other[i]);
        nStored = other.size();
    }